

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall kj::Vector<const_void_*>::setCapacity(Vector<const_void_*> *this,size_t newSize)

{
  ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> newBuilder;
  ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> local_30;
  
  if (newSize < (ulong)(*(long *)(this + 8) - *(long *)this >> 3)) {
    *(size_t *)(this + 8) = *(long *)this + newSize * 8;
  }
  local_30.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<void_const*>(newSize);
  local_30.endPtr = (Entry *)(&((local_30.ptr)->key).baseType + newSize * 4);
  local_30.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_30.pos = local_30.ptr;
  ArrayBuilder<void_const*>::addAll<kj::ArrayBuilder<void_const*>>
            ((ArrayBuilder<void_const*> *)&local_30,
             (ArrayBuilder<kj::HashMap<capnp::Type,_capnp::JsonCodec::HandlerBase_*>::Entry> *)this)
  ;
  ArrayBuilder<const_void_*>::operator=((ArrayBuilder<const_void_*> *)this,&local_30);
  ArrayBuilder<const_void_*>::dispose((ArrayBuilder<const_void_*> *)&local_30);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }